

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O0

void __thiscall Minisat::BoolOption::printOptions(BoolOption *this,FILE *pcsFile,int granularity)

{
  char *pcVar1;
  ulong uVar2;
  FILE *in_RSI;
  long *in_RDI;
  
  pcVar1 = strstr((char *)in_RDI[1],"debug");
  if (((pcVar1 == (char *)0x0) &&
      (pcVar1 = strstr((char *)in_RDI[2],"debug"), pcVar1 == (char *)0x0)) &&
     (uVar2 = (**(code **)(*in_RDI + 0x50))(), (uVar2 & 1) != 0)) {
    pcVar1 = "no";
    if ((*(byte *)(in_RDI + 6) & 1) != 0) {
      pcVar1 = "yes";
    }
    fprintf(in_RSI,"%s  {yes,no} [%s]     # %s\n",in_RDI[1],pcVar1,in_RDI[2]);
  }
  return;
}

Assistant:

void printOptions(FILE *pcsFile, int granularity)
    {

        if (strstr(name, "debug") != 0 || strstr(description, "debug") != 0) {
            return;
        } // do not print the parameter, if its related to debug output
        if (!wouldPrintOption()) {
            return;
        } // do not print option?

        fprintf(pcsFile, "%s  {yes,no} [%s]     # %s\n", name, value ? "yes" : "no", description);
    }